

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O1

void __thiscall flow::IRProgram::~IRProgram(IRProgram *this)

{
  pointer puVar1;
  IRHandler *pIVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer puVar5;
  pointer puVar6;
  ConstantValue<long,_(flow::LiteralType)2> *pCVar7;
  pointer puVar8;
  pointer puVar9;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *pCVar10;
  pointer puVar11;
  pointer puVar12;
  ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *pCVar13;
  pointer puVar14;
  pointer puVar15;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *pCVar16;
  pointer puVar17;
  pointer puVar18;
  IRBuiltinHandler *pIVar19;
  pointer puVar20;
  pointer puVar21;
  IRBuiltinFunction *pIVar22;
  int iVar23;
  pointer __old_p;
  IRHandler *pIVar24;
  pointer puVar25;
  pointer puVar26;
  pointer puVar27;
  pointer puVar28;
  pointer puVar29;
  pointer *__ptr;
  long lVar30;
  pointer puVar31;
  pointer puVar32;
  pointer pCVar33;
  pointer puVar34;
  iterator __position;
  
  puVar34 = (this->handlers_).
            super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar30 = (long)puVar1 - (long)puVar34 >> 5;
  if (0 < lVar30) {
    lVar30 = lVar30 + 1;
    puVar34 = puVar34 + 2;
    do {
      __position._M_current = puVar34;
      iVar23 = std::__cxx11::string::compare
                         ((char *)&((__position._M_current[-2]._M_t.
                                     super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                     .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)
                                   ->super_Constant).super_Value.name_);
      if (iVar23 == 0) {
        __position._M_current = __position._M_current + -2;
        goto LAB_0014f2a2;
      }
      iVar23 = std::__cxx11::string::compare
                         ((char *)&((__position._M_current[-1]._M_t.
                                     super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                     .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)
                                   ->super_Constant).super_Value.name_);
      if (iVar23 == 0) {
        __position._M_current = __position._M_current + -1;
        goto LAB_0014f2a2;
      }
      iVar23 = std::__cxx11::string::compare
                         ((char *)&((((__position._M_current)->_M_t).
                                     super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                     .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)
                                   ->super_Constant).super_Value.name_);
      if (iVar23 == 0) goto LAB_0014f2a2;
      iVar23 = std::__cxx11::string::compare
                         ((char *)&((__position._M_current[1]._M_t.
                                     super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                     .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)
                                   ->super_Constant).super_Value.name_);
      if (iVar23 == 0) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0014f2a2;
      }
      lVar30 = lVar30 + -1;
      puVar34 = __position._M_current + 4;
    } while (1 < lVar30);
    puVar34 = __position._M_current + 2;
  }
  lVar30 = (long)puVar1 - (long)puVar34 >> 3;
  if (lVar30 != 1) {
    if (lVar30 != 2) {
      __position._M_current = puVar1;
      if ((lVar30 != 3) ||
         (iVar23 = std::__cxx11::string::compare
                             ((char *)&(((puVar34->_M_t).
                                         super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                         .super__Head_base<0UL,_flow::IRHandler_*,_false>.
                                        _M_head_impl)->super_Constant).super_Value.name_),
         __position._M_current = puVar34, iVar23 == 0)) goto LAB_0014f2a2;
      puVar34 = puVar34 + 1;
    }
    iVar23 = std::__cxx11::string::compare
                       ((char *)&(((puVar34->_M_t).
                                   super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                   .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)->
                                 super_Constant).super_Value.name_);
    __position._M_current = puVar34;
    if (iVar23 == 0) goto LAB_0014f2a2;
    puVar34 = puVar34 + 1;
  }
  iVar23 = std::__cxx11::string::compare
                     ((char *)&(((puVar34->_M_t).
                                 super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                                 .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)->
                               super_Constant).super_Value.name_);
  __position._M_current = puVar34;
  if (iVar23 != 0) {
    __position._M_current = puVar1;
  }
LAB_0014f2a2:
  if (__position._M_current ==
      (this->handlers_).
      super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar24 = (IRHandler *)0x0;
  }
  else {
    pIVar24 = ((__position._M_current)->_M_t).
              super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
              super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
              super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
    super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
    super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl = (IRHandler *)0x0;
    std::
    vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
    ::_M_erase(&this->handlers_,__position);
  }
  puVar34 = (this->handlers_).
            super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar31 = puVar34;
  if (puVar1 != puVar34) {
    do {
      pIVar2 = (puVar31->_M_t).
               super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
               super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
               super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
      if (pIVar2 != (IRHandler *)0x0) {
        (**(code **)(*(long *)&(pIVar2->super_Constant).super_Value + 8))();
      }
      (puVar31->_M_t).super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>.
      _M_t.super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
      super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl = (IRHandler *)0x0;
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar1);
    (this->handlers_).
    super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar34;
  }
  if (pIVar24 != (IRHandler *)0x0) {
    (**(code **)((long)(pIVar24->super_Constant).super_Value._vptr_Value + 8))(pIVar24);
  }
  pCVar3 = (this->constantArrays_).
           super__Vector_base<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar4 = (this->constantArrays_).
           super__Vector_base<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar33 = pCVar3;
  if (pCVar4 != pCVar3) {
    do {
      (**(pCVar33->super_Constant).super_Value._vptr_Value)(pCVar33);
      pCVar33 = pCVar33 + 1;
    } while (pCVar33 != pCVar4);
    (this->constantArrays_).
    super__Vector_base<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar3;
  }
  puVar5 = (this->numbers_).
           super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->numbers_).
           super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar25 = puVar5;
  if (puVar6 != puVar5) {
    do {
      pCVar7 = (puVar25->_M_t).
               super___uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
               .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>.
               _M_head_impl;
      if (pCVar7 != (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
        (**(code **)(*(long *)&(pCVar7->super_Constant).super_Value + 8))();
      }
      (puVar25->_M_t).
      super___uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
      .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>._M_head_impl
           = (ConstantValue<long,_(flow::LiteralType)2> *)0x0;
      puVar25 = puVar25 + 1;
    } while (puVar25 != puVar6);
    (this->numbers_).
    super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar5;
  }
  puVar8 = (this->strings_).
           super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->strings_).
           super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar26 = puVar8;
  if (puVar9 != puVar8) {
    do {
      pCVar10 = (puVar26->_M_t).
                super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                .
                super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
                ._M_head_impl;
      if (pCVar10 !=
          (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
           *)0x0) {
        (**(code **)(*(long *)&(pCVar10->super_Constant).super_Value + 8))();
      }
      (puVar26->_M_t).
      super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
      .
      super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
      ._M_head_impl =
           (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
            *)0x0;
      puVar26 = puVar26 + 1;
    } while (puVar26 != puVar9);
    (this->strings_).
    super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar8;
  }
  puVar11 = (this->ipaddrs_).
            super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this->ipaddrs_).
            super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar27 = puVar11;
  if (puVar12 != puVar11) {
    do {
      pCVar13 = (puVar27->_M_t).
                super___uniq_ptr_impl<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_*,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>
                .
                super__Head_base<0UL,_flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_*,_false>
                ._M_head_impl;
      if (pCVar13 != (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)0x0) {
        (**(code **)(*(long *)&(pCVar13->super_Constant).super_Value + 8))();
      }
      (puVar27->_M_t).
      super___uniq_ptr_impl<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_*,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>
      .
      super__Head_base<0UL,_flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_*,_false>
      ._M_head_impl = (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)0x0;
      puVar27 = puVar27 + 1;
    } while (puVar27 != puVar12);
    (this->ipaddrs_).
    super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  puVar14 = (this->cidrs_).
            super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (this->cidrs_).
            super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar28 = puVar14;
  if (puVar15 != puVar14) {
    do {
      pCVar16 = (puVar28->_M_t).
                super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                .
                super__Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false>
                ._M_head_impl;
      if (pCVar16 != (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0) {
        (**(code **)(*(long *)&(pCVar16->super_Constant).super_Value + 8))();
      }
      (puVar28->_M_t).
      super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
      .super__Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false>.
      _M_head_impl = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0;
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar15);
    (this->cidrs_).
    super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar14;
  }
  puVar17 = (this->builtinHandlers_).
            super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar18 = (this->builtinHandlers_).
            super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar29 = puVar17;
  if (puVar18 != puVar17) {
    do {
      pIVar19 = (puVar29->_M_t).
                super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
                ._M_t.
                super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
                .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl;
      if (pIVar19 != (IRBuiltinHandler *)0x0) {
        (**(code **)(*(long *)&(pIVar19->super_Constant).super_Value + 8))();
      }
      (puVar29->_M_t).
      super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>.
      _M_t.
      super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
      .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl = (IRBuiltinHandler *)0x0
      ;
      puVar29 = puVar29 + 1;
    } while (puVar29 != puVar18);
    (this->builtinHandlers_).
    super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar17;
  }
  puVar20 = (this->builtinFunctions_).
            super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar21 = (this->builtinFunctions_).
            super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar32 = puVar20;
  if (puVar21 != puVar20) {
    do {
      pIVar22 = (puVar32->_M_t).
                super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                ._M_t.
                super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
                .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl;
      if (pIVar22 != (IRBuiltinFunction *)0x0) {
        (**(code **)(*(long *)&(pIVar22->super_Constant).super_Value + 8))();
      }
      (puVar32->_M_t).
      super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
      .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl =
           (IRBuiltinFunction *)0x0;
      puVar32 = puVar32 + 1;
    } while (puVar32 != puVar21);
    (this->builtinFunctions_).
    super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar20;
  }
  std::
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  ::~vector(&this->handlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  ::~vector(&this->builtinHandlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  ::~vector(&this->builtinFunctions_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
  ::~vector(&this->regexps_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
  ::~vector(&this->cidrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
  ::~vector(&this->ipaddrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
  ::~vector(&this->strings_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
  ::~vector(&this->numbers_);
  std::vector<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>::~vector
            (&this->constantArrays_);
  Value::~Value((Value *)&this->falseLiteral_);
  Value::~Value((Value *)&this->trueLiteral_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->modules_);
  return;
}

Assistant:

IRProgram::~IRProgram() {
  // first reset all standard handlers and *then* the global-scope initialization handler
  // in order to not cause confusion upon resource release
  {
    std::unique_ptr<IRHandler> global;
    auto gh = std::find_if(handlers_.begin(), handlers_.end(), [](auto& handler) {
        return handler->name() == GLOBAL_SCOPE_INIT_NAME;
    });
    if (gh != handlers_.end()) {
      global = std::move(*gh);
      handlers_.erase(gh);
    }
    handlers_.clear();
    global.reset(nullptr);
  }

  constantArrays_.clear();
  numbers_.clear();
  strings_.clear();
  ipaddrs_.clear();
  cidrs_.clear();
  builtinHandlers_.clear();
  builtinFunctions_.clear();
}